

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SupportVectorRegressor::MergeFrom
          (SupportVectorRegressor *this,SupportVectorRegressor *from)

{
  double dVar1;
  void *pvVar2;
  LogMessage *other;
  Kernel *pKVar3;
  Coefficients *pCVar4;
  SparseSupportVectors *pSVar5;
  DenseSupportVectors *pDVar6;
  SparseSupportVectors *from_00;
  DenseSupportVectors *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/SVM.pb.cc"
               ,0xc7b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if ((from != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) &&
     (from->kernel_ != (Kernel *)0x0)) {
    if (this->kernel_ == (Kernel *)0x0) {
      pKVar3 = (Kernel *)operator_new(0x20);
      Kernel::Kernel(pKVar3);
      this->kernel_ = pKVar3;
    }
    pKVar3 = from->kernel_;
    if (pKVar3 == (Kernel *)0x0) {
      pKVar3 = (Kernel *)&_Kernel_default_instance_;
    }
    Kernel::MergeFrom(this->kernel_,pKVar3);
  }
  if ((from != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) &&
     (from->coefficients_ != (Coefficients *)0x0)) {
    if (this->coefficients_ == (Coefficients *)0x0) {
      pCVar4 = (Coefficients *)operator_new(0x28);
      Coefficients::Coefficients(pCVar4);
      this->coefficients_ = pCVar4;
    }
    pCVar4 = from->coefficients_;
    if (pCVar4 == (Coefficients *)0x0) {
      pCVar4 = (Coefficients *)&_Coefficients_default_instance_;
    }
    Coefficients::MergeFrom(this->coefficients_,pCVar4);
  }
  dVar1 = from->rho_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->rho_ = dVar1;
  }
  if (from->_oneof_case_[0] == 3) {
    if (this->_oneof_case_[0] != 3) {
      clear_supportVectors(this);
      this->_oneof_case_[0] = 3;
      pDVar6 = (DenseSupportVectors *)operator_new(0x30);
      DenseSupportVectors::DenseSupportVectors(pDVar6);
      (this->supportVectors_).densesupportvectors_ = pDVar6;
    }
    pDVar6 = (this->supportVectors_).densesupportvectors_;
    if (from->_oneof_case_[0] == 3) {
      from_01 = (from->supportVectors_).densesupportvectors_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_01 = (DenseSupportVectors *)&_DenseSupportVectors_default_instance_;
    }
    DenseSupportVectors::MergeFrom(pDVar6,from_01);
  }
  else if (from->_oneof_case_[0] == 2) {
    if (this->_oneof_case_[0] != 2) {
      clear_supportVectors(this);
      this->_oneof_case_[0] = 2;
      pSVar5 = (SparseSupportVectors *)operator_new(0x30);
      SparseSupportVectors::SparseSupportVectors(pSVar5);
      (this->supportVectors_).sparsesupportvectors_ = pSVar5;
    }
    pSVar5 = (this->supportVectors_).sparsesupportvectors_;
    if (from->_oneof_case_[0] == 2) {
      from_00 = (from->supportVectors_).sparsesupportvectors_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_00 = (SparseSupportVectors *)&_SparseSupportVectors_default_instance_;
    }
    SparseSupportVectors::MergeFrom(pSVar5,from_00);
  }
  return;
}

Assistant:

void SupportVectorRegressor::MergeFrom(const SupportVectorRegressor& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SupportVectorRegressor)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_kernel()) {
    mutable_kernel()->::CoreML::Specification::Kernel::MergeFrom(from.kernel());
  }
  if (from.has_coefficients()) {
    mutable_coefficients()->::CoreML::Specification::Coefficients::MergeFrom(from.coefficients());
  }
  if (from.rho() != 0) {
    set_rho(from.rho());
  }
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
}